

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecProgramCommand.cxx
# Opt level: O3

bool cmExecProgramCommand::RunCommand
               (char *command,string *output,int *retVal,char *dir,bool verbose,Encoding encoding)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  char *__s;
  uint uVar4;
  int iVar5;
  cmsysProcess *cp;
  byte bVar6;
  cmProcessOutput processOutput;
  int length;
  char *cmd [4];
  string commandInDir;
  string strdata;
  char *data;
  string msg;
  cmProcessOutput local_10d;
  int local_10c;
  string local_108;
  int *local_e8;
  string *local_e0;
  char *local_d8;
  undefined8 local_d0;
  char local_c8;
  undefined7 uStack_c7;
  string local_b8;
  char *local_98;
  undefined1 *local_90;
  long local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  string local_70;
  string local_50;
  
  bVar3 = cmSystemTools::s_DisableRunCommandOutput;
  local_e8 = retVal;
  local_e0 = output;
  cp = cmsysProcess_New();
  if (cp == (cmsysProcess *)0x0) {
    cmSystemTools::Error("Error allocating process instance.",(char *)0x0,(char *)0x0,(char *)0x0);
    goto LAB_00296404;
  }
  local_d8 = &local_c8;
  local_d0 = 0;
  local_c8 = '\0';
  if (dir == (char *)0x0) {
    strlen(command);
    std::__cxx11::string::_M_replace((ulong)&local_d8,0,(char *)0x0,(ulong)command);
  }
  else {
    std::__cxx11::string::_M_replace((ulong)&local_d8,0,(char *)0x0,0x549e83);
    std::__cxx11::string::append((char *)&local_d8);
    std::__cxx11::string::append((char *)&local_d8);
    std::__cxx11::string::append((char *)&local_d8);
  }
  std::__cxx11::string::append((char *)&local_d8);
  __s = local_d8;
  bVar6 = ~bVar3 & verbose;
  if (bVar6 != 0) {
    paVar1 = &local_108.field_2;
    local_108._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"running ","");
    cmSystemTools::Stdout(&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar1) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,__s,(allocator<char> *)&local_b8);
    cmSystemTools::Stdout(&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar1) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    local_108._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"\n","");
    cmSystemTools::Stdout(&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar1) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
  }
  fflush(_stdout);
  fflush(_stderr);
  local_108._M_dataplus._M_p = "/bin/sh";
  local_108._M_string_length = 0x569d71;
  local_108.field_2._M_allocated_capacity = (size_type)__s;
  local_108.field_2._8_8_ = 0;
  cmsysProcess_SetCommand(cp,(char **)&local_108);
  cmsysProcess_Execute(cp);
  cmProcessOutput::cmProcessOutput(&local_10d,encoding,0x400);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  while (uVar4 = cmsysProcess_WaitForData(cp,&local_98,&local_10c,(double *)0x0), uVar4 != 0) {
    if ((uVar4 & 0xfffffffe) == 2) {
      if (bVar6 != 0) {
        cmProcessOutput::DecodeText(&local_10d,local_98,(long)local_10c,&local_b8,0);
        cmSystemTools::Stdout(&local_b8);
      }
      std::__cxx11::string::append((char *)local_e0,(ulong)local_98);
    }
  }
  if (bVar6 != 0) {
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    cmProcessOutput::DecodeText(&local_10d,&local_50,&local_b8,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
    if (local_b8._M_string_length != 0) {
      cmSystemTools::Stdout(&local_b8);
    }
  }
  cmsysProcess_WaitForExit(cp,(double *)0x0);
  pcVar2 = (local_e0->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + local_e0->_M_string_length);
  cmProcessOutput::DecodeText(&local_10d,&local_70,local_e0,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_88 = 0;
  local_80 = 0;
  local_90 = &local_80;
  iVar5 = cmsysProcess_GetState(cp);
  switch(iVar5) {
  case 1:
    *local_e8 = -1;
    std::__cxx11::string::append((char *)&local_90);
    cmsysProcess_GetErrorString(cp);
    goto LAB_0029634d;
  case 2:
    *local_e8 = -1;
    std::__cxx11::string::append((char *)&local_90);
    cmsysProcess_GetExceptionString(cp);
LAB_0029634d:
    std::__cxx11::string::append((char *)&local_90);
    break;
  case 4:
    iVar5 = cmsysProcess_GetExitValue(cp);
    *local_e8 = iVar5;
    break;
  case 5:
    *local_e8 = -1;
    std::__cxx11::string::append((char *)&local_90);
  }
  if (local_88 != 0) {
    std::__cxx11::string::_M_append((char *)local_e0,(ulong)local_90);
  }
  cmsysProcess_Delete(cp);
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                             local_b8.field_2._M_local_buf[0]) + 1);
  }
  cmProcessOutput::~cmProcessOutput(&local_10d);
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,CONCAT71(uStack_c7,local_c8) + 1);
  }
LAB_00296404:
  return cp != (cmsysProcess *)0x0;
}

Assistant:

bool cmExecProgramCommand::RunCommand(const char* command, std::string& output,
                                      int& retVal, const char* dir,
                                      bool verbose, Encoding encoding)
{
  if (cmSystemTools::GetRunCommandOutput()) {
    verbose = false;
  }

#if defined(_WIN32) && !defined(__CYGWIN__)
  // if the command does not start with a quote, then
  // try to find the program, and if the program can not be
  // found use system to run the command as it must be a built in
  // shell command like echo or dir
  int count = 0;
  std::string shortCmd;
  if (command[0] == '\"') {
    // count the number of quotes
    for (const char* s = command; *s != 0; ++s) {
      if (*s == '\"') {
        count++;
        if (count > 2) {
          break;
        }
      }
    }
    // if there are more than two double quotes use
    // GetShortPathName, the cmd.exe program in windows which
    // is used by system fails to execute if there are more than
    // one set of quotes in the arguments
    if (count > 2) {
      cmsys::RegularExpression quoted("^\"([^\"]*)\"[ \t](.*)");
      if (quoted.find(command)) {
        std::string cmd = quoted.match(1);
        std::string args = quoted.match(2);
        if (!cmSystemTools::FileExists(cmd)) {
          shortCmd = cmd;
        } else if (!cmSystemTools::GetShortPath(cmd.c_str(), shortCmd)) {
          cmSystemTools::Error("GetShortPath failed for " + cmd);
          return false;
        }
        shortCmd += " ";
        shortCmd += args;

        command = shortCmd.c_str();
      } else {
        cmSystemTools::Error("Could not parse command line with quotes ",
                             command);
      }
    }
  }
#endif

  // Allocate a process instance.
  cmsysProcess* cp = cmsysProcess_New();
  if (!cp) {
    cmSystemTools::Error("Error allocating process instance.");
    return false;
  }

#if defined(_WIN32) && !defined(__CYGWIN__)
  if (dir) {
    cmsysProcess_SetWorkingDirectory(cp, dir);
  }
  if (cmSystemTools::GetRunCommandHideConsole()) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  }
  cmsysProcess_SetOption(cp, cmsysProcess_Option_Verbatim, 1);
  const char* cmd[] = { command, 0 };
  cmsysProcess_SetCommand(cp, cmd);
#else
  std::string commandInDir;
  if (dir) {
    commandInDir = "cd \"";
    commandInDir += dir;
    commandInDir += "\" && ";
    commandInDir += command;
  } else {
    commandInDir = command;
  }
#  ifndef __VMS
  commandInDir += " 2>&1";
#  endif
  command = commandInDir.c_str();
  if (verbose) {
    cmSystemTools::Stdout("running ");
    cmSystemTools::Stdout(command);
    cmSystemTools::Stdout("\n");
  }
  fflush(stdout);
  fflush(stderr);
  const char* cmd[] = { "/bin/sh", "-c", command, nullptr };
  cmsysProcess_SetCommand(cp, cmd);
#endif

  cmsysProcess_Execute(cp);

  // Read the process output.
  int length;
  char* data;
  int p;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  while ((p = cmsysProcess_WaitForData(cp, &data, &length, nullptr))) {
    if (p == cmsysProcess_Pipe_STDOUT || p == cmsysProcess_Pipe_STDERR) {
      if (verbose) {
        processOutput.DecodeText(data, length, strdata);
        cmSystemTools::Stdout(strdata);
      }
      output.append(data, length);
    }
  }

  if (verbose) {
    processOutput.DecodeText(std::string(), strdata);
    if (!strdata.empty()) {
      cmSystemTools::Stdout(strdata);
    }
  }

  // All output has been read.  Wait for the process to exit.
  cmsysProcess_WaitForExit(cp, nullptr);
  processOutput.DecodeText(output, output);

  // Check the result of running the process.
  std::string msg;
  switch (cmsysProcess_GetState(cp)) {
    case cmsysProcess_State_Exited:
      retVal = cmsysProcess_GetExitValue(cp);
      break;
    case cmsysProcess_State_Exception:
      retVal = -1;
      msg += "\nProcess terminated due to: ";
      msg += cmsysProcess_GetExceptionString(cp);
      break;
    case cmsysProcess_State_Error:
      retVal = -1;
      msg += "\nProcess failed because: ";
      msg += cmsysProcess_GetErrorString(cp);
      break;
    case cmsysProcess_State_Expired:
      retVal = -1;
      msg += "\nProcess terminated due to timeout.";
      break;
  }
  if (!msg.empty()) {
#if defined(_WIN32) && !defined(__CYGWIN__)
    // Old Windows process execution printed this info.
    msg += "\n\nfor command: ";
    msg += command;
    if (dir) {
      msg += "\nin dir: ";
      msg += dir;
    }
    msg += "\n";
    if (verbose) {
      cmSystemTools::Stdout(msg);
    }
    output += msg;
#else
    // Old UNIX process execution only put message in output.
    output += msg;
#endif
  }

  // Delete the process instance.
  cmsysProcess_Delete(cp);

  return true;
}